

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O3

bool __thiscall CCNR::ls_solver::build_instance(ls_solver *this,string *inst)

{
  pointer *pplVar1;
  pointer this_00;
  uint uVar2;
  pointer pcVar3;
  pointer plVar4;
  iterator iVar5;
  uint uVar6;
  byte bVar7;
  size_t sVar8;
  bool bVar9;
  iterator iVar10;
  byte bVar11;
  char cVar12;
  bool bVar13;
  int iVar14;
  istream *piVar15;
  uint *puVar16;
  ulong uVar17;
  pointer plVar18;
  uint *puVar19;
  ulong uVar20;
  int cur_lit;
  lit item;
  string line;
  string tempstr2;
  string tempstr1;
  istringstream iss;
  ifstream fin;
  uint *local_468;
  iterator iStack_460;
  int *local_458;
  uint local_444;
  ulong local_440;
  lit local_438;
  undefined1 local_428 [16];
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408 [16];
  undefined1 *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8 [16];
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  long local_3b8 [2];
  string local_3a8 [104];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_418 = local_408;
  local_410 = 0;
  local_408[0] = 0;
  std::__cxx11::istringstream::istringstream((istringstream *)local_3b8);
  local_3d8 = local_3c8;
  local_3d0 = 0;
  local_3c8[0] = 0;
  local_3f8 = local_3e8;
  local_3f0 = 0;
  local_3e8[0] = 0;
  local_458 = (int *)0x0;
  local_468 = (uint *)0x0;
  iStack_460._M_current = (int *)0x0;
  std::ifstream::ifstream((istream *)local_238,(inst->_M_dataplus)._M_p,_S_in);
  cVar12 = std::__basic_file<char>::is_open();
  if (cVar12 != '\0') {
    do {
      do {
        cVar12 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                 (char)(istream *)local_238);
        piVar15 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)&local_418,cVar12);
        if (((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) != 0) goto LAB_0012c421;
        std::__cxx11::string::substr((ulong)&local_438,(ulong)&local_418);
        iVar14 = std::__cxx11::string::compare((char *)&local_438);
        if ((undefined1 *)local_438._0_8_ != local_428) {
          operator_delete((void *)local_438._0_8_);
        }
      } while (iVar14 == 0);
      std::__cxx11::string::substr((ulong)&local_438,(ulong)&local_418);
      iVar14 = std::__cxx11::string::compare((char *)&local_438);
      if ((undefined1 *)local_438._0_8_ != local_428) {
        operator_delete((void *)local_438._0_8_);
      }
    } while (iVar14 != 0);
    std::ios::clear((int)(istringstream *)local_3b8 + (int)*(undefined8 *)(local_3b8[0] + -0x18));
    std::__cxx11::stringbuf::str(local_3a8);
    std::istream::seekg((long)local_3b8,_S_beg);
    piVar15 = std::operator>>((istream *)local_3b8,(string *)&local_3d8);
    piVar15 = std::operator>>(piVar15,(string *)&local_3f8);
    piVar15 = std::istream::_M_extract<unsigned_long>((ulong *)piVar15);
    std::istream::_M_extract<unsigned_long>((ulong *)piVar15);
LAB_0012c421:
    bVar13 = make_space(this);
    if (bVar13) {
      if (this->_num_clauses != 0) {
        uVar17 = 0;
        do {
          puVar19 = local_468;
          local_468 = (uint *)0x0;
          iStack_460._M_current = (int *)0x0;
          local_458 = (int *)0x0;
          if (puVar19 != (uint *)0x0) {
            operator_delete(puVar19);
          }
          std::istream::operator>>((istream *)local_238,(int *)&local_444);
          bVar13 = false;
          while (iVar10._M_current = iStack_460._M_current, puVar19 = local_468, local_444 != 0) {
            if (!bVar13) {
              if (local_468 != (uint *)iStack_460._M_current) {
                bVar11 = 0;
                do {
                  bVar7 = bVar11;
                  puVar16 = puVar19 + 1;
                  uVar2 = *puVar19;
                  bVar9 = true;
                  if (local_444 != -uVar2) {
                    bVar9 = bVar13;
                  }
                } while (((local_444 != uVar2) && (bVar13 = bVar9, local_444 != -uVar2)) &&
                        (bVar11 = local_444 == uVar2 | bVar7, puVar19 = puVar16,
                        puVar16 != (uint *)iStack_460._M_current));
                if ((bool)(local_444 == uVar2 | bVar7)) goto LAB_0012c50e;
              }
              if (iStack_460._M_current == local_458) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_468,iStack_460,
                           (int *)&local_444);
              }
              else {
                *iStack_460._M_current = local_444;
                iStack_460._M_current = iStack_460._M_current + 1;
              }
            }
LAB_0012c50e:
            std::istream::operator>>((istream *)local_238,(int *)&local_444);
          }
          if (bVar13) {
            this->_num_clauses = this->_num_clauses - 1;
            local_468 = (uint *)0x0;
            iStack_460._M_current = (int *)0x0;
            local_458 = (int *)0x0;
            if (puVar19 != (uint *)0x0) {
              operator_delete(puVar19);
            }
          }
          else {
            local_440 = uVar17;
            if (local_468 != (uint *)iStack_460._M_current) {
              do {
                uVar2 = *puVar19;
                pcVar3 = (this->_clauses).
                         super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar17;
                uVar6 = -uVar2;
                if (0 < (int)uVar2) {
                  uVar6 = uVar2;
                }
                local_438.var_num = (size_t)uVar6;
                local_438._0_4_ = (uint)(0 < (int)uVar2) | (int)uVar17 * 2;
                iVar5._M_current =
                     (pcVar3->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (pcVar3->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::_M_realloc_insert<CCNR::lit>
                            (&pcVar3->literals,iVar5,&local_438);
                }
                else {
                  *(undefined8 *)iVar5._M_current = local_438._0_8_;
                  (iVar5._M_current)->var_num = local_438.var_num;
                  pplVar1 = &(pcVar3->literals).
                             super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                  *pplVar1 = *pplVar1 + 1;
                }
                puVar19 = puVar19 + 1;
              } while (puVar19 != (uint *)iVar10._M_current);
            }
            uVar17 = local_440 + 1;
          }
        } while (uVar17 < this->_num_clauses);
      }
      std::ifstream::close();
      uVar17 = this->_num_clauses;
      if (uVar17 != 0) {
        uVar20 = 0;
        do {
          pcVar3 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          plVar18 = *(pointer *)
                     &pcVar3[uVar20].literals.
                      super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl;
          plVar4 = *(pointer *)
                    ((long)&pcVar3[uVar20].literals.
                            super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
          if (plVar18 != plVar4) {
            do {
              local_438._0_8_ = *(undefined8 *)plVar18;
              local_438.var_num = plVar18->var_num;
              this_00 = (this->_vars).
                        super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl.
                        super__Vector_impl_data._M_start + local_438.var_num;
              iVar5._M_current =
                   *(pointer *)
                    ((long)&(this_00->literals).
                            super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
              if (iVar5._M_current ==
                  *(pointer *)
                   ((long)&(this_00->literals).
                           super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 0x10)
                 ) {
                std::vector<CCNR::lit,std::allocator<CCNR::lit>>::
                _M_realloc_insert<CCNR::lit_const&>
                          ((vector<CCNR::lit,std::allocator<CCNR::lit>> *)this_00,iVar5,&local_438);
              }
              else {
                sVar8 = plVar18->var_num;
                *(undefined8 *)iVar5._M_current = *(undefined8 *)plVar18;
                (iVar5._M_current)->var_num = sVar8;
                pplVar1 = (pointer *)
                          ((long)&(this_00->literals).
                                  super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl
                          + 8);
                *pplVar1 = *pplVar1 + 1;
              }
              plVar18 = plVar18 + 1;
            } while (plVar18 != plVar4);
            uVar17 = this->_num_clauses;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < uVar17);
      }
      bVar13 = true;
      build_neighborhood(this);
      goto LAB_0012c68e;
    }
  }
  bVar13 = false;
LAB_0012c68e:
  std::ifstream::~ifstream(local_238);
  if (local_468 != (uint *)0x0) {
    operator_delete(local_468);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
  std::ios_base::~ios_base(local_340);
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  return bVar13;
}

Assistant:

bool ls_solver::build_instance(string inst)
{
    string line;
    istringstream iss;
    size_t c, v;
    int cur_lit;
    bool lit_redundent, clause_tautology;
    string tempstr1, tempstr2;
    vector<int> temp_clause;
    ifstream fin(inst.c_str());
    if (!fin.is_open()) return false;
    while (getline(fin, line)) {
        if (line.substr(0, 1) == "c")
            continue;
        else if (line.substr(0, 1) == "p") {
            // reassign_istringstream(iss, line);
            iss.clear();
            iss.str(line);
            iss.seekg(0, ios::beg);
            iss >> tempstr1 >> tempstr2 >> _num_vars >> _num_clauses;
            break;
        }
    }
    if (!make_space()) return false;
    // read clauses, each at a time
    for (c = 0; c < _num_clauses;) {
        clause_tautology = false;
        temp_clause.clear();
        vector<int>().swap(temp_clause);
        fin >> cur_lit;
        while (cur_lit != 0) {
            if (!clause_tautology) {
                lit_redundent = false;
                for (int item : temp_clause) {
                    if (cur_lit == item) {
                        lit_redundent = true;
                        break;
                    } else if (cur_lit == -item) {
                        clause_tautology = true;
                        break;
                    }
                }
                if (!lit_redundent) {
                    temp_clause.push_back(cur_lit);
                }
            }
            fin >> cur_lit;
        }
        if (!clause_tautology) {
            for (int item : temp_clause) {
                _clauses[c].literals.push_back(lit(item, c));
            }
            c++;
        } else {
            _num_clauses--;
            temp_clause.clear();
            vector<int>().swap(temp_clause);
        }
    }
    fin.close();
    /********finish reading the input file****************/
    // build variables data structure
    for (c = 0; c < _num_clauses; c++) {
        for (lit item : _clauses[c].literals) {
            v = item.var_num;
            _vars[v].literals.push_back(item);
        }
    }
    build_neighborhood();
    return true;
}